

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_common.c
# Opt level: O0

_Bool tree_iterator_nextn(void *Iterator,size_t count)

{
  tree_iterator *ptVar1;
  void *pvVar2;
  bool bVar3;
  tree_iterator *iterator;
  size_t count_local;
  void *Iterator_local;
  
  iterator = (tree_iterator *)count;
  while( true ) {
    ptVar1 = iterator;
    bVar3 = *(long *)((long)Iterator + 8) != 0;
    if (bVar3) {
      iterator = (tree_iterator *)((long)&iterator[-1].node + 7);
    }
    if (!bVar3 || ptVar1 == (tree_iterator *)0x0) break;
    pvVar2 = tree_node_next(*(void **)((long)Iterator + 8));
    *(void **)((long)Iterator + 8) = pvVar2;
  }
  return *(long *)((long)Iterator + 8) != 0;
}

Assistant:

bool
tree_iterator_nextn(void* Iterator, size_t count)
{
    tree_iterator* iterator = Iterator;
    while (iterator->node && count--)
	iterator->node = tree_node_next(iterator->node);
    return iterator->node != NULL;
}